

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion.h
# Opt level: O1

void __thiscall Conversion::Conversion(Conversion *this,string *vocab)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string local_48;
  
  (this->indexToChar)._M_dataplus._M_p = (pointer)&(this->indexToChar).field_2;
  (this->indexToChar)._M_string_length = 0;
  (this->indexToChar).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->charToIndex)._M_t._M_impl.super__Rb_tree_header;
  (this->charToIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->charToIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->charToIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->charToIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->charToIndex)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_48._M_dataplus._M_p = (vocab->_M_dataplus)._M_p;
  paVar2 = &vocab->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p == paVar2) {
    local_48.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
    local_48.field_2._8_8_ = *(undefined8 *)((long)&vocab->field_2 + 8);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  }
  else {
    local_48.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  local_48._M_string_length = vocab->_M_string_length;
  (vocab->_M_dataplus)._M_p = (pointer)paVar2;
  vocab->_M_string_length = 0;
  (vocab->field_2)._M_local_buf[0] = '\0';
  setVocab(this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

Conversion::Conversion(string vocab) {
    setVocab(std::move(vocab));
}